

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall
EnvironmentNAVXYTHETALAT::GetLazyPreds
          (EnvironmentNAVXYTHETALAT *this,int TargetStateID,
          vector<int,_std::allocator<int>_> *PredIDV,vector<int,_std::allocator<int>_> *CostV,
          vector<bool,_std::allocator<bool>_> *isTrueCost)

{
  value_type pEVar1;
  value_type pEVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference ppEVar6;
  size_type sVar7;
  reference ppEVar8;
  ulong uVar9;
  long lVar10;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  long *in_RDI;
  EnvNAVXYTHETALATHashEntry_t *OutHashEntry;
  int predTheta;
  int predY;
  int predX;
  EnvNAVXYTHETALATAction_t *nav3daction;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *actionsV;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  int aind;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
  *in_stack_ffffffffffffff48;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
  *in_stack_ffffffffffffff50;
  long *in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 __x;
  int local_2c;
  
  ppEVar6 = std::
            vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
            operator[]((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                        *)(in_RDI + 0x34),(long)in_ESI);
  pEVar1 = *ppEVar6;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x175857);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x175864);
  std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::size
            ((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
             (in_RDI[0x1e] + (ulong)(uint)(int)pEVar1->Theta * 0x18));
  std::vector<int,_std::allocator<int>_>::reserve
            (in_RDX,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::size
            ((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
             (in_RDI[0x1e] + (ulong)(uint)(int)pEVar1->Theta * 0x18));
  std::vector<int,_std::allocator<int>_>::reserve
            (in_RDX,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_2c = 0;
  while (iVar3 = local_2c,
        sVar7 = std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                ::size((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                        *)(in_RDI[0x1e] + (ulong)(uint)(int)pEVar1->Theta * 0x18)),
        iVar3 < (int)sVar7) {
    ppEVar8 = std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::
              at(in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    pEVar2 = *ppEVar8;
    iVar3 = pEVar1->X - (int)pEVar2->dX;
    iVar4 = pEVar1->Y - (int)pEVar2->dY;
    iVar5 = (int)pEVar2->starttheta;
    uVar9 = (**(code **)(*in_RDI + 0x208))(in_RDI,iVar3,iVar4);
    if ((uVar9 & 1) != 0) {
      this_00 = (vector<int,_std::allocator<int>_> *)in_RDI[0x38];
      if (((ulong)this_00 & 1) != 0) {
        this_00 = *(vector<int,_std::allocator<int>_> **)
                   ((long)this_00 + *(long *)((long)in_RDI + in_RDI[0x39]) + -1);
      }
      lVar10 = (*(code *)this_00)((long *)((long)in_RDI + in_RDI[0x39]),iVar3,iVar4,iVar5);
      if (lVar10 == 0) {
        in_stack_ffffffffffffff50 =
             (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
             in_RDI[0x3a];
        in_stack_ffffffffffffff58 = (long *)((long)in_RDI + in_RDI[0x3b]);
        in_stack_ffffffffffffff48 = in_stack_ffffffffffffff50;
        if (((ulong)in_stack_ffffffffffffff50 & 1) != 0) {
          in_stack_ffffffffffffff48 =
               *(vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> **)
                ((long)in_stack_ffffffffffffff50 + *in_stack_ffffffffffffff58 + -1);
        }
        (*(code *)in_stack_ffffffffffffff48)(in_stack_ffffffffffffff58,iVar3,iVar4,iVar5);
      }
      __x = (undefined1)((uint)iVar5 >> 0x18);
      std::vector<int,_std::allocator<int>_>::push_back
                (this_00,(value_type_conflict1 *)in_stack_ffffffffffffff58);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
                 (value_type_conflict1 *)in_stack_ffffffffffffff48);
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)CONCAT44(iVar3,iVar4),(bool)__x);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetLazyPreds(
    int TargetStateID,
    std::vector<int>* PredIDV,
    std::vector<int>* CostV,
    std::vector<bool>* isTrueCost)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    // get X, Y for the state
    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[TargetStateID];

    // clear the successor array
    PredIDV->clear();
    CostV->clear();
    PredIDV->reserve(EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size());
    CostV->reserve(EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size());

    // iterate through actions
    std::vector<EnvNAVXYTHETALATAction_t*>* actionsV = &EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta];
    for (aind = 0; aind < (int)EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size(); aind++)
    {
        EnvNAVXYTHETALATAction_t* nav3daction = actionsV->at(aind);

        int predX = HashEntry->X - nav3daction->dX;
        int predY = HashEntry->Y - nav3daction->dY;
        int predTheta = nav3daction->starttheta;

        //skip the invalid cells
        if (!IsValidCell(predX, predY)) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
        if ((OutHashEntry = (this->*GetHashEntry)(predX, predY, predTheta)) == NULL) {
            OutHashEntry = (this->*CreateNewHashEntry)(predX, predY, predTheta);
        }

        PredIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(nav3daction->cost);
        isTrueCost->push_back(false);
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}